

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# font_to_svg.hpp
# Opt level: O2

void __thiscall font2svg::ttf_file::ttf_file(ttf_file *this,string *fname)

{
  FT_Face_conflict *ppFVar1;
  FT_Error FVar2;
  ostream *poVar3;
  
  (this->filename)._M_dataplus._M_p = (pointer)&(this->filename).field_2;
  (this->filename)._M_string_length = 0;
  (this->filename).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_assign((string *)this);
  FVar2 = FT_Init_FreeType(&this->library);
  this->error = FVar2;
  poVar3 = std::operator<<((ostream *)(debug_abi_cxx11_ + 0x10),"Init error code: ");
  std::ostream::operator<<(poVar3,this->error);
  ppFVar1 = &this->face;
  FVar2 = FT_New_Face(this->library,(this->filename)._M_dataplus._M_p,0,ppFVar1);
  this->error = FVar2;
  poVar3 = std::operator<<((ostream *)(debug_abi_cxx11_ + 0x10),"\nFace load error code: ");
  std::ostream::operator<<(poVar3,this->error);
  poVar3 = std::operator<<((ostream *)(debug_abi_cxx11_ + 0x10),"\nfont filename: ");
  std::operator<<(poVar3,(string *)this);
  if (this->error == 0) {
    poVar3 = std::operator<<((ostream *)(debug_abi_cxx11_ + 0x10),"\nFamily Name: ");
    std::operator<<(poVar3,(*ppFVar1)->family_name);
    poVar3 = std::operator<<((ostream *)(debug_abi_cxx11_ + 0x10),"\nStyle Name: ");
    std::operator<<(poVar3,(*ppFVar1)->style_name);
    poVar3 = std::operator<<((ostream *)(debug_abi_cxx11_ + 0x10),"\nNumber of faces: ");
    std::ostream::_M_insert<long>((long)poVar3);
    poVar3 = std::operator<<((ostream *)(debug_abi_cxx11_ + 0x10),"\nNumber of glyphs: ");
    std::ostream::_M_insert<long>((long)poVar3);
    return;
  }
  poVar3 = std::operator<<((ostream *)&std::cerr,"problem loading file ");
  poVar3 = std::operator<<(poVar3,(string *)this);
  std::operator<<(poVar3,"\n");
  exit(1);
}

Assistant:

ttf_file( std::string fname )
	{
		filename = fname;
		error = FT_Init_FreeType( &library );
		debug << "Init error code: " << error;

		// Load a typeface
		error = FT_New_Face( library, filename.c_str(), 0, &face );
		debug << "\nFace load error code: " << error;
		debug << "\nfont filename: " << filename;
		if (error) {
			std::cerr << "problem loading file " << filename << "\n";
			exit(1);
		}
		debug << "\nFamily Name: " << face->family_name;
		debug << "\nStyle Name: " << face->style_name;
		debug << "\nNumber of faces: " << face->num_faces;
		debug << "\nNumber of glyphs: " << face->num_glyphs;
	}